

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EscapeCodeGenerator.hpp
# Opt level: O0

EscapeCode * __thiscall
yb::ANSIEscapeCodeGenerator::cursorForward_abi_cxx11_
          (EscapeCode *__return_storage_ptr__,ANSIEscapeCodeGenerator *this,uint n)

{
  bool local_62;
  allocator<char> local_61;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint local_1c;
  ANSIEscapeCodeGenerator *pAStack_18;
  uint n_local;
  ANSIEscapeCodeGenerator *this_local;
  
  local_1c = n;
  pAStack_18 = this;
  this_local = (ANSIEscapeCodeGenerator *)__return_storage_ptr__;
  if (n == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    if (n != 1) {
      std::__cxx11::to_string(&local_60,n);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    }
    local_62 = n == 1;
    std::operator+(&local_40,&this->EscapeCodeStart,&local_60);
    std::operator+(__return_storage_ptr__,&local_40,'C');
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    if (local_62) {
      std::allocator<char>::~allocator(&local_61);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

EscapeCode cursorForward(unsigned int n) const override {
        if (!n) return EscapeCode{};
        return EscapeCodeStart + (n == 1 ? "" : std::to_string(n)) + 'C';
    }